

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
guess_documentation_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  char cVar1;
  code *pcVar2;
  
  std::istream::ignore();
  cVar1 = std::istream::peek();
  if (cVar1 == '/') {
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    pcVar2 = single_line_documentation_state;
  }
  else {
    if (cVar1 != '*') {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      return __return_storage_ptr__;
    }
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    pcVar2 = multi_line_documentation_state;
  }
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t guess_documentation_state(MetaConfiguration &conf, std::ifstream &f,
                                     int &error) {
  f.ignore();
  char c = f.peek();
  switch (c) {
  case '*':
    return multi_line_documentation_state;
  case '/':
    return single_line_documentation_state;
  }
  return nullptr;
}